

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O2

Event * __thiscall iaf_psc_alpha::update(iaf_psc_alpha *this,double n_dt)

{
  iaf_psc_alpha_param *piVar1;
  SpikeEvent *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  this->dt = n_dt;
  if (this->shouldCalibrate == true) {
    calibrate(this);
    this->shouldCalibrate = false;
  }
  if (this->r_ == 0) {
    piVar1 = this->param;
    dVar3 = this->dI_ex_;
    dVar4 = this->I_ex_;
    dVar5 = this->dI_in_;
    dVar6 = this->I_in_;
    dVar7 = this->expm1_tau_m_ * this->y3_ +
            dVar6 * this->P32_in_ +
            this->P31_in_ * dVar5 +
            dVar4 * this->P32_ex_ + (this->y0_ + piVar1->I_e_) * this->P30_ + this->P31_ex_ * dVar3
            + this->y3_;
    dVar2 = piVar1->LowerBound_;
    if (piVar1->LowerBound_ <= dVar7) {
      dVar2 = dVar7;
    }
    this->y3_ = dVar2;
  }
  else {
    this->r_ = this->r_ + -1;
    dVar3 = this->dI_ex_;
    dVar4 = this->I_ex_;
    dVar5 = this->dI_in_;
    dVar6 = this->I_in_;
    dVar2 = this->y3_;
    piVar1 = this->param;
  }
  this->dI_ex_ = this->ex_spikes_ * this->EPSCInitialValue_ + this->P11_ex_ * dVar3;
  this->I_ex_ = dVar3 * this->P21_ex_ + this->P22_ex_ * dVar4;
  this->weighted_spikes_ex_ = this->ex_spikes_;
  this->weighted_spikes_in_ = this->in_spikes_;
  this->dI_in_ = this->in_spikes_ * this->IPSCInitialValue_ + this->P11_in_ * dVar5;
  this->I_in_ = dVar5 * this->P21_in_ + this->P22_in_ * dVar6;
  if (piVar1->Theta_ <= dVar2) {
    this->r_ = this->RefractoryCounts_;
    dVar2 = piVar1->V_reset_;
    this->y3_ = dVar2;
    Logging::logValue((this->super_Neuron).logger,(this->super_Neuron).populationID,
                      (this->super_Neuron).neuronID,0,dVar2 + piVar1->E_L_);
    this_00 = (SpikeEvent *)operator_new(0x28);
    SpikeEvent::SpikeEvent(this_00);
  }
  else {
    Logging::logValue((this->super_Neuron).logger,(this->super_Neuron).populationID,
                      (this->super_Neuron).neuronID,0,dVar2 + piVar1->E_L_);
    this_00 = (SpikeEvent *)operator_new(0x18);
    NoEvent::NoEvent((NoEvent *)this_00);
  }
  return &this_00->super_Event;
}

Assistant:

Event* iaf_psc_alpha::update(double n_dt) {
    dt = n_dt;
    if(shouldCalibrate) {
        calibrate();
        shouldCalibrate = false;
    }
    if ( r_ == 0 )
    {
      // neuron not refractory
      y3_ = P30_ * ( y0_ + param->I_e_ ) + P31_ex_ * dI_ex_ + P32_ex_ * I_ex_ + P31_in_ * dI_in_
        + P32_in_ * I_in_ + expm1_tau_m_ * y3_ + y3_;
    
      // lower bound of membrane potential
      y3_ = ( y3_ < param->LowerBound_ ? param->LowerBound_ : y3_ );
    }
    else
    {
      // neuron is absolute refractory
      --r_;
    }


    // alpha shape EPSCs
    I_ex_ = P21_ex_ * dI_ex_ + P22_ex_ * I_ex_;
    dI_ex_ *= P11_ex_;

    // Apply spikes delivered in this step; spikes arriving at T+1 have
    // an immediate effect on the state of the neuron
    weighted_spikes_ex_ = ex_spikes_;
    dI_ex_ += EPSCInitialValue_ * weighted_spikes_ex_;

    // alpha shape EPSCs
    I_in_ = P21_in_ * dI_in_ + P22_in_ * I_in_;
    dI_in_ *= P11_in_;

    // Apply spikes delivered in this step; spikes arriving at T+1 have
    // an immediate effect on the state of the neuron
    weighted_spikes_in_ = in_spikes_;
    dI_in_ += IPSCInitialValue_ * weighted_spikes_in_;


    
    // threshold crossing
    if ( y3_ >= param->Theta_ )
    {
      r_ = RefractoryCounts_;
      y3_ = param->V_reset_;
      // A supra-threshold membrane potential should never be observable.
      // The reset at the time of threshold crossing enables accurate
      // integration independent of the computation step size, see [2,3] for
      // details.
      logger->logValue(populationID, neuronID, ValueType::voltage, y3_ + param->E_L_);
      return new SpikeEvent();
    }
    logger->logValue(populationID, neuronID, ValueType::voltage, y3_ + param->E_L_);
    return new NoEvent();
}